

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O1

int __thiscall
DataContainer::InitUnzip(DataContainer *this,ITypeManager *manager,uchar *zipped_buffer,int size)

{
  short sVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  pointer pcVar6;
  int iVar7;
  char *__s;
  NodeFS *pNVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  _Alloc_hider _Var13;
  int iVar14;
  bool bVar15;
  string local_90;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (size < 1) {
    bVar15 = true;
    lVar11 = -1;
  }
  else {
    uVar10 = (ulong)(uint)size;
    do {
      iVar7 = (int)(uVar10 - 1);
      if (*(int *)(zipped_buffer + (uVar10 - 1)) != 0x6054b50) {
        iVar7 = -1;
      }
      bVar15 = iVar7 == -1;
    } while ((1 < (long)uVar10) && (uVar10 = uVar10 - 1, iVar7 == -1));
    lVar11 = (long)iVar7;
  }
  iVar7 = -1;
  if (!bVar15) {
    iVar7 = (int)*(short *)(zipped_buffer + lVar11 + 8);
    if (0 < *(short *)(zipped_buffer + lVar11 + 8)) {
      iVar14 = *(int *)(zipped_buffer + lVar11 + 0x10);
      do {
        if (*(int *)(zipped_buffer + iVar14) != 0x2014b50) {
          return -1;
        }
        iVar4 = *(int *)(zipped_buffer + (long)iVar14 + 0x26);
        uVar5 = *(uint *)(zipped_buffer + (long)iVar14 + 0x2a);
        sVar1 = *(short *)(zipped_buffer + (long)iVar14 + 0x1c);
        sVar12 = (size_t)(int)sVar1;
        sVar2 = *(short *)(zipped_buffer + (long)iVar14 + 0x1e);
        sVar3 = *(short *)(zipped_buffer + (long)iVar14 + 0x20);
        __s = (char *)operator_new__(sVar12 + 1);
        memcpy(__s,zipped_buffer + (long)iVar14 + 0x2e,sVar12);
        __s[sVar12] = '\0';
        if (iVar4 == 0x10) {
          paVar9 = &local_70.field_2;
          local_70._M_dataplus._M_p = (pointer)paVar9;
          sVar12 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,__s,__s + sVar12);
          pNVar8 = NodeFS::InsertDir(&this->zip_file_,&local_70);
          bVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_70._M_dataplus._M_p == paVar9;
          _Var13._M_p = local_70._M_dataplus._M_p;
        }
        else {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          sVar12 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar12);
          pNVar8 = NodeFS::InsertFile(&this->zip_file_,&local_90,zipped_buffer);
          paVar9 = &local_40;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          pNVar8->offset_ = uVar5;
          pcVar6 = (pNVar8->name_)._M_dataplus._M_p;
          local_50[0] = paVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_50,pcVar6,pcVar6 + (pNVar8->name_)._M_string_length);
          (**manager->_vptr_ITypeManager)(manager,(string *)local_50);
          bVar15 = local_50[0] == paVar9;
          _Var13._M_p = (pointer)local_50[0];
        }
        if (!bVar15) {
          operator_delete(_Var13._M_p,paVar9->_M_allocated_capacity + 1);
        }
        if ((pNVar8 != (NodeFS *)0x0) && (*(int *)(zipped_buffer + (int)uVar5) == 0x4034b50)) {
          pNVar8->offset_ = uVar5;
        }
        iVar14 = iVar14 + sVar1 + (int)sVar2 + (int)sVar3 + 0x2e;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int DataContainer::InitUnzip(ITypeManager* manager, unsigned char* zipped_buffer, int size)
{
   auto return_value = -1;

   // ZIP format : Find EOCD
   int offset_eocd = -1;
   for (int offset = size - 1; offset >= 0 && offset_eocd == -1; offset --)
   {
      if (*(unsigned int*)(&zipped_buffer[offset]) == 0x06054B50)
      {
         offset_eocd = offset;
      }
   }
   if (offset_eocd != -1)
   {
      return_value = 0;
      // Found : Get infos.
      int nb_central_dir = *(short*)&(zipped_buffer[offset_eocd + 8]);
      int offset_dir = *(int*)&(zipped_buffer[offset_eocd + 16]);

      // Now, look at central directories
      for (int cd = 0; cd < nb_central_dir; cd ++)
      {
         // Check signature
         if (*(unsigned int*)(&zipped_buffer[offset_dir]) == 0x02014b50)
         {
            // check version min
            // Compression method
            short min_version = *(short*)&(zipped_buffer[offset_dir + 6]);
            short comp_method = *(short*)&(zipped_buffer[offset_dir + 10]);
            short ifile_attrib = *(short*)&(zipped_buffer[offset_dir + 36]);
            int efile_attrib = *(int*)&(zipped_buffer[offset_dir + 38]);

            //
            int off_local_header = *(int*)&(zipped_buffer[offset_dir + 42]);
            // Sizes
            int filename_size = *(short*)(&zipped_buffer[offset_dir + 28]);
            int extra_size = *(short*)(&zipped_buffer[offset_dir + 30]);
            int Comment_size = *(short*)(&zipped_buffer[offset_dir + 32]);
            char* filename = new char [filename_size + 1];
            memcpy(filename, &zipped_buffer[offset_dir + 46], filename_size);
            filename[filename_size] = 0;

            // Directory ?
            NodeFS* added_element;
            if (efile_attrib == FILE_ATTRIBUTE_DIRECTORY)
            {
               // New node :
               added_element = zip_file_.InsertDir(filename);
            }
            else
            {
               // File
               added_element = zip_file_.InsertFile(filename, zipped_buffer);

               added_element->offset_ = off_local_header;
               // Update file type count
               int file_type = manager->GetTypeFromFile(added_element->name_);
            }

            // local file header
            unsigned char* local_header = &zipped_buffer[off_local_header];
            if (*(unsigned int*)(&local_header[0]) == 0x04034b50)
            {
               short min_version = *(short*)&(local_header[4]);
               short flags = *(short*)&(local_header[6]);
               short comp_method = *(short*)&(local_header[8]);

               if (added_element != nullptr)
               {
                  added_element->offset_ = off_local_header;
               }
            }
            offset_dir += 46 + filename_size + extra_size + Comment_size;
         }
         else
         {
            // Error !
            return -1;
         }
      }
   }
   return return_value;
}